

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExplicitAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,ExpressionSyntax **args_5,
          Token *args_6)

{
  Token dot;
  Token direction;
  Token closeParen;
  ExplicitAnsiPortSyntax *pEVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_R8;
  Token *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  Info *in_stack_ffffffffffffff60;
  
  pEVar1 = (ExplicitAnsiPortSyntax *)
           allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  direction.info = (Info *)*in_stack_00000010;
  direction._0_8_ = pEVar1;
  dot.info = in_stack_ffffffffffffff60;
  dot._0_8_ = in_stack_00000010[1];
  closeParen.info = (Info *)*in_RDX;
  closeParen._0_8_ = in_RCX[1];
  slang::syntax::ExplicitAnsiPortSyntax::ExplicitAnsiPortSyntax
            ((ExplicitAnsiPortSyntax *)*in_stack_00000010,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000008,direction,dot,
             *in_R9,*in_R8,(ExpressionSyntax *)*in_RCX,closeParen);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }